

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing_deps_test.cc
# Opt level: O1

void __thiscall
MissingDependencyScannerTestMissingDepPresent::Run
          (MissingDependencyScannerTestMissingDepPresent *this)

{
  bool bVar1;
  string local_58;
  string local_38;
  
  MissingDependencyScannerTest::CreateInitialState(&this->super_MissingDependencyScannerTest);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"compiled_object","");
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"generated_header","");
  MissingDependencyScannerTest::RecordDepsLogDep
            (&this->super_MissingDependencyScannerTest,&local_38,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  MissingDependencyScannerTest::ProcessAllNodes(&this->super_MissingDependencyScannerTest);
  bVar1 = testing::Test::Check
                    (g_current_test,
                     (this->super_MissingDependencyScannerTest).scanner_.nodes_missing_deps_._M_t.
                     _M_impl.super__Rb_tree_header._M_node_count != 0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/missing_deps_test.cc"
                     ,0x6b,"scanner().HadMissingDeps()");
  if ((bVar1) &&
     (bVar1 = testing::Test::Check
                        (g_current_test,
                         (this->super_MissingDependencyScannerTest).scanner_.nodes_missing_deps_.
                         _M_t._M_impl.super__Rb_tree_header._M_node_count == 1,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/missing_deps_test.cc"
                         ,0x6c,"1u == scanner().nodes_missing_deps_.size()"), bVar1)) {
    bVar1 = testing::Test::Check
                      (g_current_test,
                       (this->super_MissingDependencyScannerTest).scanner_.missing_dep_path_count_
                       == 1,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/missing_deps_test.cc"
                       ,0x6d,"1u == scanner().missing_dep_path_count_");
    if (bVar1) {
      MissingDependencyScannerTest::AssertMissingDependencyBetween
                (&this->super_MissingDependencyScannerTest,"compiled_object","generated_header",
                 &(this->super_MissingDependencyScannerTest).generator_rule_);
      return;
    }
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    return;
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  return;
}

Assistant:

TEST_F(MissingDependencyScannerTest, MissingDepPresent) {
  CreateInitialState();
  // compiled_object uses generated_header, without a proper dependency
  RecordDepsLogDep("compiled_object", "generated_header");
  ProcessAllNodes();
  ASSERT_TRUE(scanner().HadMissingDeps());
  ASSERT_EQ(1u, scanner().nodes_missing_deps_.size());
  ASSERT_EQ(1u, scanner().missing_dep_path_count_);
  AssertMissingDependencyBetween("compiled_object", "generated_header",
                                 &generator_rule_);
}